

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileLED.cpp
# Opt level: O0

void __thiscall TileLED::followWire(TileLED *this,Direction direction,State state)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  value_type *in_RDI;
  
  std::vector<TileLED_*,_std::allocator<TileLED_*>_>::push_back
            ((vector<TileLED_*,_std::allocator<TileLED_*>_> *)CONCAT44(in_ESI,in_EDX),in_RDI);
  return;
}

Assistant:

void TileLED::followWire(Direction direction, State state) {
    Board::endpointLEDs.push_back(this);
}